

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

EVdfg INT_EVdfg_create(EVmaster master)

{
  int iVar1;
  __pid_t _Var2;
  EVdfg __s;
  pthread_t pVar3;
  EVdfg_configuration p_Var4;
  EVdfg_stone *pp_Var5;
  EVmaster in_RDI;
  CMTraceType in_stack_0000000c;
  CManager in_stack_00000010;
  timespec ts;
  EVdfg dfg;
  int in_stack_ffffffffffffffcc;
  FILE *in_stack_ffffffffffffffd0;
  CMPollFunc in_stack_ffffffffffffffd8;
  CManager_conflict in_stack_ffffffffffffffe0;
  long local_18;
  
  __s = (EVdfg)INT_CMmalloc((size_t)in_stack_ffffffffffffffd0);
  memset(__s,0,0x58);
  __s->master = in_RDI;
  __s->deployed_stone_count = 0;
  __s->deploy_ack_condition = -1;
  in_RDI->dfg = __s;
  if (in_RDI->client != (EVclient)0x0) {
    in_RDI->client->dfg = __s;
    __s->client = in_RDI->client;
  }
  in_RDI->reconfig = 0;
  in_RDI->sig_reconfig_bool = 0;
  in_RDI->old_node_count = 1;
  in_RDI->state = DFG_Joining;
  iVar1 = CMtrace_val[0xd];
  if (in_RDI->cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(in_stack_00000010,in_stack_0000000c);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_ffffffffffffffd0 = (FILE *)in_RDI->cm->CMTrace_file;
      _Var2 = getpid();
      in_stack_ffffffffffffffd8 = (CMPollFunc)(long)_Var2;
      pVar3 = pthread_self();
      fprintf(in_stack_ffffffffffffffd0,"P%lxT%lx - ",in_stack_ffffffffffffffd8,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&stack0xffffffffffffffe0);
      fprintf((FILE *)in_RDI->cm->CMTrace_file,"%lld.%.9ld - ",in_stack_ffffffffffffffe0,local_18);
    }
    fprintf((FILE *)in_RDI->cm->CMTrace_file,"EVDFG initialization -  master DFG state set to %s\n",
            str_state[in_RDI->state]);
  }
  fflush((FILE *)in_RDI->cm->CMTrace_file);
  p_Var4 = new_dfg_configuration((EVdfg)in_stack_ffffffffffffffd0);
  __s->working_state = p_Var4;
  pp_Var5 = (EVdfg_stone *)INT_CMmalloc((size_t)in_stack_ffffffffffffffd0);
  __s->stones = pp_Var5;
  INT_CMadd_shutdown_task
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc);
  return __s;
}

Assistant:

extern EVdfg
INT_EVdfg_create(EVmaster master)
{
    EVdfg dfg = malloc(sizeof(struct _EVdfg));

    memset(dfg, 0, sizeof(struct _EVdfg));
    dfg->master = master;
    dfg->deployed_stone_count = 0;
    dfg->deploy_ack_condition = -1;
    master->dfg = dfg;
    if (master->client) {
	master->client->dfg = dfg;
	dfg->client = master->client;
    }
    master->reconfig = 0;
    master->sig_reconfig_bool = 0;
    master->old_node_count = 1;
    master->state = DFG_Joining;
    CMtrace_out(master->cm, EVdfgVerbose, "EVDFG initialization -  master DFG state set to %s\n", str_state[master->state]);

    dfg->working_state = new_dfg_configuration(dfg);
    dfg->stones = malloc(sizeof(dfg->stones[0]));
    INT_CMadd_shutdown_task(master->cm, free_dfg, dfg, FREE_TASK);
    return dfg;
}